

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O0

int stun_attr_xor_sockaddr_add(stun_msg_hdr *msg_hdr,uint16_t type,sockaddr *addr)

{
  stun_attr_xor_sockaddr *attr_00;
  int status;
  stun_attr_xor_sockaddr *attr;
  sockaddr *addr_local;
  uint16_t type_local;
  stun_msg_hdr *msg_hdr_local;
  
  attr_00 = (stun_attr_xor_sockaddr *)stun_msg_end(msg_hdr);
  msg_hdr_local._4_4_ = stun_attr_xor_sockaddr_init(attr_00,type,addr,msg_hdr);
  if (msg_hdr_local._4_4_ == 0) {
    stun_msg_add_attr(msg_hdr,(stun_attr_hdr *)attr_00);
    msg_hdr_local._4_4_ = 0;
  }
  return msg_hdr_local._4_4_;
}

Assistant:

int stun_attr_xor_sockaddr_add(stun_msg_hdr *msg_hdr,
                               uint16_t type, const struct sockaddr *addr) {
  stun_attr_xor_sockaddr *attr =
      (stun_attr_xor_sockaddr *)stun_msg_end(msg_hdr);
  int status = stun_attr_xor_sockaddr_init(attr, type, addr, msg_hdr);
  if (status != STUN_OK)
    return status;
  stun_msg_add_attr(msg_hdr, &attr->hdr);
  return STUN_OK;
}